

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDataServerCommand.cpp
# Opt level: O1

void __thiscall OpenDataServerCommand::~OpenDataServerCommand(OpenDataServerCommand *this)

{
  ~OpenDataServerCommand(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

OpenDataServerCommand::~OpenDataServerCommand() {
  close(this->client_socket);
}